

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O2

void linker_relrefs(GlobalVars *gv)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  node *pnVar3;
  Section *sec;
  char *pcVar4;
  Symbol *pSVar5;
  Symbol *pSVar6;
  byte bVar7;
  Section *s;
  Reloc *pRVar8;
  Symbol *local_50;
  Symbol *local_40;
  
  pnVar3 = (node *)&gv->selobjects;
  pSVar5 = (Symbol *)0x0;
  local_50 = (Symbol *)0x0;
  local_40 = (Symbol *)0x0;
  do {
    pnVar3 = pnVar3->next;
    if (pnVar3->next == (node *)0x0) {
      return;
    }
    s = (Section *)(pnVar3 + 2);
LAB_0010be65:
    s = (Section *)(s->n).next;
  } while ((s->n).next == (node *)0x0);
  s->relrefs = (RelRef *)0x0;
  pRVar8 = (Reloc *)&s->xrefs;
  while (pRVar8 = (Reloc *)(pRVar8->n).next, (pRVar8->n).next != (node *)0x0) {
    set_last_sec_reloc(s,pRVar8);
    pSVar6 = (pRVar8->relocsect).symbol;
    if (((pSVar6 != (Symbol *)0x0) && (sec = pSVar6->relsect, sec != (Section *)0x0)) &&
       ((pSVar6->type & 0xfe) == 2)) {
      bVar7 = pRVar8->rtype;
      if ((((ulong)bVar7 < 0x23) && ((0x600000400U >> ((ulong)bVar7 & 0x3f) & 1) != 0)) &&
         (pSVar6->type == 3)) {
        sec = scommon_section(gv,sec->obj);
        pSVar6->relsect = sec;
        bVar7 = pRVar8->rtype;
      }
      if ((bVar7 == 0x22) || (bVar7 == 10)) {
        sec->flags = sec->flags | 4;
        if ((gv->textbaserel == 0) && (sec->type == '\x01')) {
          pcVar4 = getobjname(s->obj);
          error(0x79,pcVar4,s->name,pRVar8->offset);
        }
      }
      else if ((bVar7 == 2) && (sec != s)) {
        addrelref(&s->relrefs,sec);
      }
    }
  }
  pRVar8 = (Reloc *)&s->relocs;
switchD_0010bf9b_caseD_5:
  pRVar8 = (Reloc *)(pRVar8->n).next;
  if ((pRVar8->n).next == (node *)0x0) goto LAB_0010be65;
  set_last_sec_reloc(s,pRVar8);
  uVar2 = pRVar8->rtype;
  switch(uVar2) {
  case '\x02':
    if ((pRVar8->relocsect).ptr != s) {
      addrelref(&s->relrefs,(pRVar8->relocsect).ptr);
    }
    goto switchD_0010bf9b_caseD_5;
  case '\x03':
  case '\x04':
    dyn_reloc_entry(gv,pRVar8,4);
  case '\x05':
  case '\x06':
  case '\t':
    goto switchD_0010bf9b_caseD_5;
  case '\a':
  case '\b':
    dyn_reloc_entry(gv,pRVar8,5);
    goto switchD_0010bf9b_caseD_5;
  case '\n':
    puVar1 = &((pRVar8->relocsect).ptr)->flags;
    *puVar1 = *puVar1 | 4;
    if (pSVar5 == (Symbol *)0x0) {
      pSVar5 = find_any_symbol(gv,s,"_SDA_BASE_");
      if (pSVar5 == (Symbol *)0x0) {
        pSVar5 = (Symbol *)0x0;
      }
      else {
        pSVar5->flags = pSVar5->flags | 2;
      }
    }
    break;
  default:
    if (uVar2 == ' ') {
      if (local_50 == (Symbol *)0x0) {
        pSVar6 = find_any_symbol(gv,s,"_SDA2_BASE_");
        local_50 = (Symbol *)0x0;
        if (pSVar6 != (Symbol *)0x0) {
          pSVar6->flags = pSVar6->flags | 2;
          local_50 = pSVar6;
        }
      }
      goto switchD_0010bf9b_caseD_5;
    }
    if (uVar2 != '\"') goto switchD_0010bf9b_caseD_5;
    puVar1 = &((pRVar8->relocsect).ptr)->flags;
    *puVar1 = *puVar1 | 4;
    if (local_40 == (Symbol *)0x0) {
      local_40 = find_any_symbol(gv,s,"__r13_init");
      if (local_40 == (Symbol *)0x0) {
        local_40 = (Symbol *)0x0;
      }
      else {
        local_40->flags = local_40->flags | 2;
      }
    }
  }
  if ((gv->textbaserel == 0) && (((pRVar8->relocsect).ptr)->type == '\x01')) {
    pcVar4 = getobjname(s->obj);
    error(0x79,pcVar4,s->name,pRVar8->offset);
  }
  goto switchD_0010bf9b_caseD_5;
}

Assistant:

void linker_relrefs(struct GlobalVars *gv)
/* All relocations and unresolved xrefs with a relative reference
   to other sections are collected. A second task is to detect
   and handle base-relative and GOT/PLT references. */
{
  struct ObjectUnit *obj;
  struct Section *sec;
  struct Symbol *sdabase = NULL;
  struct Symbol *sda2base = NULL;
  struct Symbol *r13init = NULL;

  for (obj=(struct ObjectUnit *)gv->selobjects.first;
       obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {

    for (sec=(struct Section *)obj->sections.first;
         sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
      struct RelRef **rr = &sec->relrefs;
      struct Symbol *xdef;
      struct Reloc *xref,*reloc;

      for (*rr=NULL,xref=(struct Reloc *)sec->xrefs.first;
           xref->n.next!=NULL; xref=(struct Reloc *)xref->n.next) {

        /* remember offset of sections's last xref */
        set_last_sec_reloc(sec,xref);

        if (xdef = xref->relocsect.symbol) {
          if (xdef->relsect!=NULL &&
              (xdef->type==SYM_RELOC || xdef->type==SYM_COMMON)) {

            if ((xref->rtype==R_SD || xref->rtype==R_SD21 ||
                 xref->rtype==R_MOSDREL) && xdef->type==SYM_COMMON) {
                /* small data common symbol - assign .scommon section */
                xdef->relsect = scommon_section(gv,xdef->relsect->obj);
            }

            if (xref->rtype==R_PC && xdef->relsect!=sec) {
              /* relative reference to different section */
              addrelref(rr,xdef->relsect);
            }

            else if (xref->rtype==R_SD || xref->rtype==R_MOSDREL) {
              /* other section is accessed base relative from this one */
              xdef->relsect->flags |= SF_SMALLDATA;
              if (!gv->textbaserel && xdef->relsect->type==ST_CODE)
                error(121,getobjname(sec->obj),sec->name,xref->offset);
            }
          }
        }
      }

      for (reloc=(struct Reloc *)sec->relocs.first;
           reloc->n.next!=NULL; reloc=(struct Reloc *)reloc->n.next) {

        /* remember offset of sections's last reloc */
        set_last_sec_reloc(sec,reloc);

        if (reloc->rtype==R_PC && reloc->relocsect.ptr!=sec) {
          /* relative reference to different section */
          addrelref(rr,reloc->relocsect.ptr);
        }

        else if (reloc->rtype==R_GOT || reloc->rtype==R_GOTPC) {
          /* a local relocation to a GOT entry may create that entry */
          dyn_reloc_entry(gv,reloc,GOT_LOCAL);
        }

        else if (reloc->rtype==R_PLT || reloc->rtype==R_PLTPC) {
          /* a local relocation to a PLT entry may create that entry */
          dyn_reloc_entry(gv,reloc,PLT_LOCAL);
        }

        else if (reloc->rtype == R_SD) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!sdabase) {
            /* R_SD relocation implies a reference to _SDA_BASE_ */
            if (sdabase = find_any_symbol(gv,sec,sdabase_name))
              sdabase->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

        else if (reloc->rtype == R_SD2) {
          if (!sda2base) {
            /* R_SD2 relocation implies a reference to _SDA2_BASE_ */
            if (sda2base = find_any_symbol(gv,sec,sda2base_name))
              sda2base->flags |= SYMF_REFERENCED;
          }
        }

        else if (reloc->rtype == R_MOSDREL) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!r13init) {
            /* R_MOSDREL relocation implies a reference to __r13_init */
            if (r13init = find_any_symbol(gv,sec,r13init_name))
              r13init->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

      }
    }
  }
}